

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::WriteCustomCommandBuild
          (cmGlobalNinjaGenerator *this,string *command,string *description,string *comment,
          bool uses_terminal,cmNinjaDeps *outputs,cmNinjaDeps *deps,cmNinjaDeps *orderOnly)

{
  pointer pcVar1;
  bool bVar2;
  mapped_type *pmVar3;
  cmGlobalNinjaGenerator *this_00;
  string *path;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string cmd;
  cmNinjaVars vars;
  cmNinjaDeps local_48;
  
  cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
  pcVar1 = (command->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&cmd,pcVar1,pcVar1 + command->_M_string_length);
  AddCustomCommandRule(this);
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar1 = local_d8 + 0x10;
  local_d8._0_8_ = pcVar1;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"COMMAND","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)local_d8);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  if ((pointer)local_d8._0_8_ != pcVar1) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  EncodeLiteral((string *)local_d8,description);
  local_b8._M_allocated_capacity = (size_type)&local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"DESC","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&local_b8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_allocated_capacity != &local_a8) {
    operator_delete((void *)local_b8._M_allocated_capacity,
                    CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
  }
  if ((pointer)local_d8._0_8_ != pcVar1) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if (uses_terminal) {
    bVar2 = SupportsConsolePool(this);
    if (bVar2) {
      local_d8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"pool","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)local_d8);
      std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0x5033cf);
      if ((pointer)local_d8._0_8_ != pcVar1) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
      }
    }
  }
  this_00 = (cmGlobalNinjaGenerator *)this->BuildFileStream;
  local_d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"CUSTOM_COMMAND","");
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._8_8_ = 0;
  local_a8._M_local_buf[0] = '\0';
  local_b8._M_allocated_capacity = (size_type)&local_a8;
  WriteBuild(this,(ostream *)this_00,comment,(string *)local_d8,outputs,deps,&local_48,orderOnly,
             &vars,(string *)&local_b8,-1,(bool *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_allocated_capacity != &local_a8) {
    this_00 = (cmGlobalNinjaGenerator *)
              (CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
    operator_delete((void *)local_b8._M_allocated_capacity,(ulong)this_00);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    this_00 = (cmGlobalNinjaGenerator *)(local_d8._16_8_ + 1);
    operator_delete((void *)local_d8._0_8_,(ulong)this_00);
  }
  if ((this->ComputingUnknownDependencies == true) &&
     (path = (deps->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
     path != (deps->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)) {
    do {
      EncodePath((string *)local_d8,this_00,path);
      this_00 = (cmGlobalNinjaGenerator *)local_d8;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->CombinedCustomCommandExplicitDependencies,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        this_00 = (cmGlobalNinjaGenerator *)(local_d8._16_8_ + 1);
        operator_delete((void *)local_d8._0_8_,(ulong)this_00);
      }
      path = path + 1;
    } while (path != (deps->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmd._M_dataplus._M_p != &cmd.field_2) {
    operator_delete(cmd._M_dataplus._M_p,cmd.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
cmGlobalNinjaGenerator::WriteCustomCommandBuild(const std::string& command,
                                                const std::string& description,
                                                const std::string& comment,
                                                bool uses_terminal,
                                                const cmNinjaDeps& outputs,
                                                const cmNinjaDeps& deps,
                                                const cmNinjaDeps& orderOnly)
{
  std::string cmd = command;
#ifdef _WIN32
   if (cmd.empty())
      // TODO Shouldn't an empty command be handled by ninja?
      cmd = "cmd.exe /c";
#endif

  this->AddCustomCommandRule();

  cmNinjaVars vars;
  vars["COMMAND"] = cmd;
  vars["DESC"] = EncodeLiteral(description);
  if (uses_terminal && SupportsConsolePool())
    {
    vars["pool"] = "console";
    }

  this->WriteBuild(*this->BuildFileStream,
                   comment,
                   "CUSTOM_COMMAND",
                   outputs,
                   deps,
                   cmNinjaDeps(),
                   orderOnly,
                   vars);

  if (this->ComputingUnknownDependencies)
    {
    //we need to track every dependency that comes in, since we are trying
    //to find dependencies that are side effects of build commands
    for(cmNinjaDeps::const_iterator i = deps.begin(); i != deps.end(); ++i)
      {
      this->CombinedCustomCommandExplicitDependencies.insert(EncodePath(*i));
      }
    }
}